

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_KillMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int selector;
  bool bVar1;
  AActor *source;
  AActor *inflictor;
  AActor *pAVar2;
  AActor *pAVar3;
  int iVar4;
  int selector_00;
  int flags;
  char *pcVar5;
  int iVar6;
  PClassActor *local_40;
  FName local_38;
  FName local_34;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003ee743;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ee714:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ee743:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17c4,
                  "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003ee55e;
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ee743;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003ee714;
LAB_003ee55e:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee7d1:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c5,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[1].field_0.i;
LAB_003ee5b3:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee7f0:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c6,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[2].field_0.i;
LAB_003ee5c2:
    if (param[3].field_0.field_3.Type != '\x03') {
LAB_003ee71d:
      pcVar5 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_003ee724:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c7,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_40 = (PClassActor *)param[3].field_0.field_1.a;
    if (param[3].field_0.field_1.atag != 1) {
      if (local_40 != (PClassActor *)0x0) goto LAB_003ee71d;
      local_40 = (PClassActor *)0x0;
    }
LAB_003ee5e4:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee7a0:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c8,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[4].field_0.i;
LAB_003ee5f3:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee781:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17c9,
                    "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    selector_00 = param[5].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee7d1;
    }
    iVar4 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003ee5b3;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee7f0;
    }
    flags = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003ee5c2;
    }
    if ((param[3].field_0.field_3.Type != '\x03') ||
       (local_40 = (PClassActor *)param[3].field_0.field_1.a,
       local_40 != (PClassActor *)0x0 && param[3].field_0.field_1.atag != 1)) {
      pcVar5 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_003ee724;
    }
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003ee5e4;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee7a0;
    }
    iVar6 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003ee5f3;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ee781;
    }
    selector_00 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003ee762;
      }
      goto LAB_003ee615;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ee762:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17ca,
                  "int AF_AActor_A_KillMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003ee615:
  selector = param[6].field_0.i;
  source = COPY_AAPTR(pAVar3,selector_00);
  inflictor = COPY_AAPTR(pAVar3,selector);
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->master);
  if (pAVar2 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar3->master);
    local_38.Index = iVar6;
    local_34.Index = iVar4;
    DoKill(pAVar3,inflictor,source,&local_34,flags,local_40,&local_38);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src); 
	AActor *inflictor = COPY_AAPTR(self, inflict);

	if (self->master != NULL)
		DoKill(self->master, inflictor, source, damagetype, flags, filter, species);
	return 0;
}